

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitcoin-util.cpp
# Opt level: O0

void SetupBitcoinUtilArgs(ArgsManager *argsman)

{
  long lVar1;
  char *in_RDI;
  long in_FS_OFFSET;
  ArgsManager *unaff_retaddr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff18;
  allocator<char> *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  allocator<char> local_8a;
  allocator<char> local_89 [33];
  OptionsCategory *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa4;
  string *in_stack_ffffffffffffffa8;
  ArgsManager *in_stack_ffffffffffffffb0;
  ArgsManager *in_stack_ffffffffffffffb8;
  ArgsManager *in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  SetupHelpOptions(in_stack_ffffffffffffffd0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff68,in_RDI,in_stack_ffffffffffffff58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff68,in_RDI,in_stack_ffffffffffffff58);
  ArgsManager::AddArg(in_stack_ffffffffffffffb8,(string *)in_stack_ffffffffffffffb0,
                      in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,in_stack_ffffffffffffff98)
  ;
  std::__cxx11::string::~string(in_stack_ffffffffffffff18);
  std::allocator<char>::~allocator(&local_8a);
  std::__cxx11::string::~string(in_stack_ffffffffffffff18);
  std::allocator<char>::~allocator(local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff68,in_RDI,in_stack_ffffffffffffff58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff68,in_RDI,in_stack_ffffffffffffff58);
  ArgsManager::AddCommand
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
             (string *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  std::__cxx11::string::~string(in_stack_ffffffffffffff18);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff6e);
  std::__cxx11::string::~string(in_stack_ffffffffffffff18);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff6f);
  SetupChainParamsBaseOptions(unaff_retaddr);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void SetupBitcoinUtilArgs(ArgsManager &argsman)
{
    SetupHelpOptions(argsman);

    argsman.AddArg("-version", "Print version and exit", ArgsManager::ALLOW_ANY, OptionsCategory::OPTIONS);

    argsman.AddCommand("grind", "Perform proof of work on hex header string");

    SetupChainParamsBaseOptions(argsman);
}